

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inflate.c
# Opt level: O1

int updatewindow(z_streamp strm,Bytef *end,uint copy)

{
  internal_state *piVar1;
  voidpf pvVar2;
  uint uVar3;
  uint uVar4;
  
  piVar1 = strm->state;
  if (*(long *)(piVar1 + 0x48) == 0) {
    pvVar2 = (*strm->zalloc)(strm->opaque,1 << ((byte)piVar1[0x38] & 0x1f),1);
    *(voidpf *)(piVar1 + 0x48) = pvVar2;
    if (pvVar2 == (voidpf)0x0) {
      return 1;
    }
  }
  if (*(int *)(piVar1 + 0x3c) == 0) {
    *(int *)(piVar1 + 0x3c) = 1 << ((byte)piVar1[0x38] & 0x1f);
    *(undefined8 *)(piVar1 + 0x40) = 0;
  }
  uVar4 = *(uint *)(piVar1 + 0x3c);
  if (copy < uVar4) {
    uVar4 = uVar4 - *(uint *)(piVar1 + 0x44);
    uVar3 = copy;
    if (uVar4 < copy) {
      uVar3 = uVar4;
    }
    memcpy((void *)((ulong)*(uint *)(piVar1 + 0x44) + *(long *)(piVar1 + 0x48)),end + -(ulong)copy,
           (ulong)uVar3);
    if (copy <= uVar4) {
      uVar4 = *(int *)(piVar1 + 0x44) + uVar3;
      if (uVar4 == *(uint *)(piVar1 + 0x3c)) {
        uVar4 = 0;
      }
      *(uint *)(piVar1 + 0x44) = uVar4;
      if (*(uint *)(piVar1 + 0x3c) <= *(uint *)(piVar1 + 0x40)) {
        return 0;
      }
      *(uint *)(piVar1 + 0x40) = *(uint *)(piVar1 + 0x40) + uVar3;
      return 0;
    }
    uVar3 = copy - uVar3;
    memcpy(*(void **)(piVar1 + 0x48),end + -(ulong)uVar3,(ulong)uVar3);
    *(uint *)(piVar1 + 0x44) = uVar3;
  }
  else {
    memcpy(*(void **)(piVar1 + 0x48),end + -(ulong)uVar4,(ulong)uVar4);
    *(undefined4 *)(piVar1 + 0x44) = 0;
  }
  *(undefined4 *)(piVar1 + 0x40) = *(undefined4 *)(piVar1 + 0x3c);
  return 0;
}

Assistant:

local int updatewindow(z_streamp strm, const Bytef *end, unsigned copy) {
    struct inflate_state FAR *state;
    unsigned dist;

    state = (struct inflate_state FAR *)strm->state;

    /* if it hasn't been done already, allocate space for the window */
    if (state->window == Z_NULL) {
        state->window = (unsigned char FAR *)
                        ZALLOC(strm, 1U << state->wbits,
                               sizeof(unsigned char));
        if (state->window == Z_NULL) return 1;
    }

    /* if window not in use yet, initialize */
    if (state->wsize == 0) {
        state->wsize = 1U << state->wbits;
        state->wnext = 0;
        state->whave = 0;
    }

    /* copy state->wsize or less output bytes into the circular window */
    if (copy >= state->wsize) {
        zmemcpy(state->window, end - state->wsize, state->wsize);
        state->wnext = 0;
        state->whave = state->wsize;
    }
    else {
        dist = state->wsize - state->wnext;
        if (dist > copy) dist = copy;
        zmemcpy(state->window + state->wnext, end - copy, dist);
        copy -= dist;
        if (copy) {
            zmemcpy(state->window, end - copy, copy);
            state->wnext = copy;
            state->whave = state->wsize;
        }
        else {
            state->wnext += dist;
            if (state->wnext == state->wsize) state->wnext = 0;
            if (state->whave < state->wsize) state->whave += dist;
        }
    }
    return 0;
}